

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::Group(Group *this,Mem *m)

{
  Mem *m_local;
  Group *this_local;
  
  LObject::LObject(&this->super_LObject,m);
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
  super__Object._vptr__Object = (_func_int **)&PTR__Group_002ebb98;
  this->sln_change_monitoring_periods_to_go = 0;
  this->act_change_monitoring_periods_to_go = 0;
  std::mutex::mutex(&this->mutex);
  std::
  unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
  ::unordered_map(&this->ipgm_views);
  std::
  unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
  ::unordered_map(&this->anti_ipgm_views);
  std::
  unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
  ::unordered_map(&this->input_less_ipgm_views);
  std::
  unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
  ::unordered_map(&this->notification_views);
  std::
  unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
  ::unordered_map(&this->group_views);
  std::
  unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
  ::unordered_map(&this->other_views);
  std::
  unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
  ::unordered_map(&this->viewing_groups);
  std::multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
  ::multiset(&this->newly_salient_views);
  std::vector<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>::vector
            (&this->new_controllers);
  std::vector<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>::vector
            (&this->pending_operations);
  reset_ctrl_values(this);
  reset_stats(this);
  reset_decay_values(this);
  return;
}

Assistant:

Group::Group(r_code::Mem *m): LObject(m)
{
    reset_ctrl_values();
    reset_stats();
    reset_decay_values();
}